

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo1344.c
# Opt level: O0

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct,uint8_t *ss,uint8_t *pk)

{
  unsigned_long __vla_expr0;
  uint32_t ss_init_len;
  uint16_t mu_encode [64];
  uint16_t b_matrix [10752];
  uint16_t v_matrix [64];
  uint16_t a_matrix [1806336];
  uint16_t bp_matrix [10752];
  uint8_t *c2;
  uint8_t *c1;
  uint8_t shake_input_seed_se [33];
  uint8_t auStack_151e8 [8];
  uint8_t r [43136];
  uint16_t epp_matrix [64];
  uint16_t ep_matrix [10752];
  uint16_t sp_matrix [10752];
  uint8_t *b;
  uint8_t *seed_a;
  uint8_t *k;
  uint8_t *seed_se;
  uint8_t pkh_mu [64];
  uint8_t seed_se_k [64];
  uint8_t coins [32];
  uint8_t *pk_local;
  uint8_t *ss_local;
  uint8_t *ct_local;
  
  memset(seed_se_k + 0x38,0,0x20);
  randombytes_(0x20,seed_se_k + 0x38);
  memset(pkh_mu + 0x38,0,0x40);
  memset(&seed_se,0,0x40);
  Hacl_Hash_SHA3_shake256((uint8_t *)&seed_se,0x20,pk,0x5410);
  pkh_mu[0x18] = seed_se_k[0x38];
  pkh_mu[0x19] = seed_se_k[0x39];
  pkh_mu[0x1a] = seed_se_k[0x3a];
  pkh_mu[0x1b] = seed_se_k[0x3b];
  pkh_mu[0x1c] = seed_se_k[0x3c];
  pkh_mu[0x1d] = seed_se_k[0x3d];
  pkh_mu[0x1e] = seed_se_k[0x3e];
  pkh_mu[0x1f] = seed_se_k[0x3f];
  Hacl_Hash_SHA3_shake256(pkh_mu + 0x38,0x40,(uint8_t *)&seed_se,0x40);
  memset(ep_matrix + 0x29fc,0,0x5400);
  memset(epp_matrix + 0x3c,0,0x5400);
  memset(r + 0xa878,0,0x80);
  memset(auStack_151e8,0,0xa880);
  memset(&c1,0,0x21);
  c1._0_1_ = 0x96;
  Hacl_Hash_SHA3_shake256(auStack_151e8,0xa880,(uint8_t *)&c1,0x21);
  Lib_Memzero0_memzero0(&c1,0x21);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,0x540,auStack_151e8,ep_matrix + 0x29fc);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,0x540,r + 0x53f8,epp_matrix + 0x3c);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,8,r + 43000,(uint16_t *)(r + 0xa878));
  memset(a_matrix + 0x1b8ffc,0,0x5400);
  memset(v_matrix + 0x3c,0,0x372000);
  Hacl_Impl_Frodo_Params_frodo_gen_matrix('\0',0x540,pk,v_matrix + 0x3c);
  Hacl_Impl_Matrix_matrix_mul(8,0x540,0x540,ep_matrix + 0x29fc,v_matrix + 0x3c,a_matrix + 0x1b8ffc);
  Hacl_Impl_Matrix_matrix_add(8,0x540,a_matrix + 0x1b8ffc,epp_matrix + 0x3c);
  Hacl_Impl_Frodo_Pack_frodo_pack(8,0x540,0x10,a_matrix + 0x1b8ffc,ct);
  memset(b_matrix + 0x29fc,0,0x80);
  memset(mu_encode + 0x3c,0,0x5400);
  Hacl_Impl_Frodo_Pack_frodo_unpack(0x540,8,0x10,pk + 0x10,mu_encode + 0x3c);
  Hacl_Impl_Matrix_matrix_mul(8,0x540,8,ep_matrix + 0x29fc,mu_encode + 0x3c,b_matrix + 0x29fc);
  Hacl_Impl_Matrix_matrix_add(8,8,b_matrix + 0x29fc,(uint16_t *)(r + 0xa878));
  memset(&stack0xffffffffffc6e4d8,0,0x80);
  Hacl_Impl_Frodo_Encode_frodo_key_encode
            (0x10,4,8,seed_se_k + 0x38,(uint16_t *)&stack0xffffffffffc6e4d8);
  Hacl_Impl_Matrix_matrix_add(8,8,b_matrix + 0x29fc,(uint16_t *)&stack0xffffffffffc6e4d8);
  Lib_Memzero0_memzero0(&stack0xffffffffffc6e4d8,0x80);
  Hacl_Impl_Frodo_Pack_frodo_pack(8,8,0x10,b_matrix + 0x29fc,ct + 0x5400);
  Lib_Memzero0_memzero0(b_matrix + 0x29fc,0x80);
  Lib_Memzero0_memzero0(ep_matrix + 0x29fc,0x5400);
  Lib_Memzero0_memzero0(epp_matrix + 0x3c,0x5400);
  Lib_Memzero0_memzero0(r + 0xa878,0x80);
  __vla_expr0 = (unsigned_long)&stack0xffffffffffc6e4b8;
  memset(&stack0xffffffffffc69018,0,0x54a0);
  memcpy(&stack0xffffffffffc69018,ct,0x5480);
  Hacl_Hash_SHA3_shake256(ss,0x20,&stack0xffffffffffc69018,0x54a0);
  Lib_Memzero0_memzero0(&stack0xffffffffffc69018,0x54a0);
  Lib_Memzero0_memzero0(pkh_mu + 0x38,0x40);
  Lib_Memzero0_memzero0(seed_se_k + 0x38,0x20);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct, uint8_t *ss, uint8_t *pk)
{
  uint8_t coins[32U] = { 0U };
  randombytes_(32U, coins);
  uint8_t seed_se_k[64U] = { 0U };
  uint8_t pkh_mu[64U] = { 0U };
  Hacl_Hash_SHA3_shake256(pkh_mu, 32U, pk, 21520U);
  memcpy(pkh_mu + 32U, coins, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(seed_se_k, 64U, pkh_mu, 64U);
  uint8_t *seed_se = seed_se_k;
  uint8_t *k = seed_se_k + 32U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  uint16_t sp_matrix[10752U] = { 0U };
  uint16_t ep_matrix[10752U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[43136U] = { 0U };
  uint8_t shake_input_seed_se[33U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(r, 43136U, shake_input_seed_se, 33U);
  Lib_Memzero0_memzero(shake_input_seed_se, 33U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r + 21504U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 8U, r + 43008U, epp_matrix);
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 21504U;
  uint16_t bp_matrix[10752U] = { 0U };
  KRML_CHECK_SIZE(sizeof (uint16_t), 1806336U);
  uint16_t a_matrix[1806336U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 1344U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 1344U, sp_matrix, a_matrix, bp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 1344U, bp_matrix, ep_matrix);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 1344U, 16U, bp_matrix, c1);
  uint16_t v_matrix[64U] = { 0U };
  uint16_t b_matrix[10752U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(1344U, 8U, 16U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 8U, sp_matrix, b_matrix, v_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(16U, 4U, 8U, coins, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 8U, 16U, v_matrix, c2);
  Lib_Memzero0_memzero(v_matrix, 64U, uint16_t, void *);
  Lib_Memzero0_memzero(sp_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint32_t ss_init_len = 21664U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t shake_input_ss[ss_init_len];
  memset(shake_input_ss, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(shake_input_ss, ct, 21632U * sizeof (uint8_t));
  memcpy(shake_input_ss + 21632U, k, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(ss, 32U, shake_input_ss, ss_init_len);
  Lib_Memzero0_memzero(shake_input_ss, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 64U, uint8_t, void *);
  Lib_Memzero0_memzero(coins, 32U, uint8_t, void *);
  return 0U;
}